

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
          (QMovableArrayOps<QByteArray> *this,qsizetype i,QByteArray *args)

{
  qsizetype *pqVar1;
  QByteArray **ppQVar2;
  Data *pDVar3;
  Data *pDVar4;
  char *pcVar5;
  QByteArray *pQVar6;
  qsizetype qVar7;
  QTypedArrayData<char> *__old_val;
  char *__old_val_1;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_80;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size == i) {
      qVar7 = QArrayDataPointer<QByteArray>::freeSpaceAtEnd((QArrayDataPointer<QByteArray> *)this);
      if (qVar7 == 0) goto LAB_00284fab;
      QArrayDataPointer<char>::QArrayDataPointer
                (&(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr
                  [(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                   size].d,&args->d);
LAB_002850e6:
      pqVar1 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_002850a1;
    }
LAB_00284fab:
    if (i == 0) {
      qVar7 = QArrayDataPointer<QByteArray>::freeSpaceAtBegin((QArrayDataPointer<QByteArray> *)this)
      ;
      if (qVar7 != 0) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (&(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                    ptr[-1].d,&args->d);
        ppQVar2 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                   ptr;
        *ppQVar2 = *ppQVar2 + -1;
        goto LAB_002850e6;
      }
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pDVar4 = (args->d).d;
  pcVar5 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (char *)0x0;
  qVar7 = (args->d).size;
  (args->d).size = 0;
  bVar8 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size != 0;
  QArrayDataPointer<QByteArray>::detachAndGrow
            ((QArrayDataPointer<QByteArray> *)this,(uint)(i == 0 && bVar8),1,(QByteArray **)0x0,
             (QArrayDataPointer<QByteArray> *)0x0);
  if (i == 0 && bVar8) {
    pQVar6 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr;
    pQVar6[-1].d.d = pDVar4;
    pQVar6[-1].d.ptr = pcVar5;
    pQVar6[-1].d.size = qVar7;
    (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr = pQVar6 + -1
    ;
    pqVar1 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QByteArray> *)this,i,1);
    ((local_80.displaceFrom)->d).d = pDVar4;
    ((local_80.displaceFrom)->d).ptr = pcVar5;
    ((local_80.displaceFrom)->d).size = qVar7;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  local_58.size = 0;
  local_58.ptr = (char *)0x0;
  local_58.d = (Data *)0x0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
LAB_002850a1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }